

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_create_boot_catalog(archive_write *a,isoent *rootent)

{
  iso9660_conflict *iso9660_00;
  __uid_t _Var1;
  __gid_t _Var2;
  int iVar3;
  isofile *file_00;
  isoent *piVar4;
  int64_t iVar5;
  char *pcVar6;
  archive_string *dest;
  archive *in_RDI;
  archive_entry *entry;
  isoent *isoent;
  isofile *file;
  iso9660_conflict *iso9660;
  isofile *in_stack_00000050;
  archive_write *in_stack_00000058;
  isoent **in_stack_00000130;
  archive_write *in_stack_00000138;
  isofile *in_stack_ffffffffffffffa8;
  archive_entry *in_stack_ffffffffffffffb0;
  archive_write *in_stack_ffffffffffffffb8;
  archive_entry *paVar7;
  int local_4;
  
  iso9660_00 = *(iso9660_conflict **)&in_RDI[1].current_codepage;
  file_00 = isofile_new(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (file_00 == (isofile *)0x0) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
    local_4 = -0x1e;
  }
  else {
    archive_entry_set_pathname(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    archive_entry_set_size(file_00->entry,0x800);
    archive_entry_set_mtime(file_00->entry,iso9660_00->birth_time,0);
    archive_entry_set_atime(file_00->entry,iso9660_00->birth_time,0);
    archive_entry_set_ctime(file_00->entry,iso9660_00->birth_time,0);
    paVar7 = file_00->entry;
    _Var1 = getuid();
    archive_entry_set_uid(paVar7,(ulong)_Var1);
    paVar7 = file_00->entry;
    _Var2 = getgid();
    archive_entry_set_gid(paVar7,(ulong)_Var2);
    archive_entry_set_mode(file_00->entry,0x8124);
    archive_entry_set_nlink(file_00->entry,1);
    iVar3 = isofile_gen_utility_names(in_stack_00000058,in_stack_00000050);
    if (iVar3 < -0x14) {
      isofile_free((isofile *)in_stack_ffffffffffffffb0);
      local_4 = -0x1e;
    }
    else {
      file_00->boot = BOOT_CATALOG;
      (file_00->content).size = 0x800;
      isofile_add_entry(iso9660_00,file_00);
      piVar4 = isoent_new(in_stack_ffffffffffffffa8);
      if (piVar4 == (isoent *)0x0) {
        archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
        local_4 = -0x1e;
      }
      else {
        piVar4->field_0xe8 = piVar4->field_0xe8 & 0xfe | 1;
        iVar3 = isoent_tree(in_stack_00000138,in_stack_00000130);
        if (iVar3 == 0) {
          (iso9660_00->el_torito).catalog = piVar4;
          dest = (archive_string *)(ulong)((uint)iso9660_00->opt >> 9 & 3);
          switch(dest) {
          default:
            paVar7 = ((iso9660_00->el_torito).boot)->file->entry;
            iVar5 = archive_entry_size(paVar7);
            if (iVar5 == 0x12c000) {
              (iso9660_00->el_torito).media_type = '\x01';
            }
            else {
              iVar5 = archive_entry_size(paVar7);
              if (iVar5 == 0x168000) {
                (iso9660_00->el_torito).media_type = '\x02';
              }
              else {
                pcVar6 = (char *)archive_entry_size(paVar7);
                if (pcVar6 == "_len_l( &mstr, utf16be_nfd, 100000, f_sconv16be)") {
                  (iso9660_00->el_torito).media_type = '\x03';
                }
                else {
                  (iso9660_00->el_torito).media_type = '\0';
                }
              }
            }
            break;
          case (archive_string *)0x1:
            (iso9660_00->el_torito).media_type = '\0';
            break;
          case (archive_string *)0x2:
            paVar7 = ((iso9660_00->el_torito).boot)->file->entry;
            iVar5 = archive_entry_size(paVar7);
            if (iVar5 < 0x12c001) {
              (iso9660_00->el_torito).media_type = '\x01';
            }
            else {
              iVar5 = archive_entry_size(paVar7);
              if (iVar5 < 0x168001) {
                (iso9660_00->el_torito).media_type = '\x02';
              }
              else {
                iVar5 = archive_entry_size(paVar7);
                if (0x2d0000 < iVar5) {
                  archive_set_error(in_RDI,-1,
                                    "Boot image file(``%s\'\') size is too big for fd type.",
                                    (iso9660_00->el_torito).boot_filename.s);
                  return -0x1e;
                }
                (iso9660_00->el_torito).media_type = '\x03';
              }
            }
            break;
          case (archive_string *)0x3:
            (iso9660_00->el_torito).media_type = '\x04';
          }
          (iso9660_00->el_torito).system_type = '\0';
          if (((uint)iso9660_00->opt >> 0x16 & 1) != 0) {
            (iso9660_00->el_torito).id.length = 0;
            archive_string_concat(dest,(archive_string *)in_stack_ffffffffffffffa8);
          }
          local_4 = 0;
        }
        else {
          local_4 = -0x1e;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
isoent_create_boot_catalog(struct archive_write *a, struct isoent *rootent)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file;
	struct isoent *isoent;
	struct archive_entry *entry;

	(void)rootent; /* UNUSED */
	/*
	 * Create the entry which is the "boot.catalog" file.
	 */
	file = isofile_new(a, NULL);
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	archive_entry_set_pathname(file->entry,
	    iso9660->el_torito.catalog_filename.s);
	archive_entry_set_size(file->entry, LOGICAL_BLOCK_SIZE);
	archive_entry_set_mtime(file->entry, iso9660->birth_time, 0);
	archive_entry_set_atime(file->entry, iso9660->birth_time, 0);
	archive_entry_set_ctime(file->entry, iso9660->birth_time, 0);
	archive_entry_set_uid(file->entry, getuid());
	archive_entry_set_gid(file->entry, getgid());
	archive_entry_set_mode(file->entry, AE_IFREG | 0444);
	archive_entry_set_nlink(file->entry, 1);

	if (isofile_gen_utility_names(a, file) < ARCHIVE_WARN) {
		isofile_free(file);
		return (ARCHIVE_FATAL);
	}
	file->boot = BOOT_CATALOG;
	file->content.size = LOGICAL_BLOCK_SIZE;
	isofile_add_entry(iso9660, file);

	isoent = isoent_new(file);
	if (isoent == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	isoent->virtual = 1;

	/* Add the "boot.catalog" entry into tree */
	if (isoent_tree(a, &isoent) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	iso9660->el_torito.catalog = isoent;
	/*
	 * Get a boot medai type.
	 */
	switch (iso9660->opt.boot_type) {
	default:
	case OPT_BOOT_TYPE_AUTO:
		/* Try detecting a media type of the boot image. */
		entry = iso9660->el_torito.boot->file->entry;
		if (archive_entry_size(entry) == FD_1_2M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_1_2M_DISKETTE;
		else if (archive_entry_size(entry) == FD_1_44M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_1_44M_DISKETTE;
		else if (archive_entry_size(entry) == FD_2_88M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_2_88M_DISKETTE;
		else
			/* We cannot decide whether the boot image is
			 * hard-disk. */
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_NO_EMULATION;
		break;
	case OPT_BOOT_TYPE_NO_EMU:
		iso9660->el_torito.media_type = BOOT_MEDIA_NO_EMULATION;
		break;
	case OPT_BOOT_TYPE_HARD_DISK:
		iso9660->el_torito.media_type = BOOT_MEDIA_HARD_DISK;
		break;
	case OPT_BOOT_TYPE_FD:
		entry = iso9660->el_torito.boot->file->entry;
		if (archive_entry_size(entry) <= FD_1_2M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_1_2M_DISKETTE;
		else if (archive_entry_size(entry) <= FD_1_44M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_1_44M_DISKETTE;
		else if (archive_entry_size(entry) <= FD_2_88M_SIZE)
			iso9660->el_torito.media_type =
			    BOOT_MEDIA_2_88M_DISKETTE;
		else {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Boot image file(``%s'') size is too big "
			    "for fd type.",
			    iso9660->el_torito.boot_filename.s);
			return (ARCHIVE_FATAL);
		}
		break;
	}

	/*
	 * Get a system type.
	 * TODO: `El Torito' specification says "A copy of byte 5 from the
	 *       Partition Table found in the boot image".
	 */
	iso9660->el_torito.system_type = 0;

	/*
	 * Get an ID.
	 */
	if (iso9660->opt.publisher)
		archive_string_copy(&(iso9660->el_torito.id),
		    &(iso9660->publisher_identifier));


	return (ARCHIVE_OK);
}